

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O2

void __thiscall
ear::GainCalculatorObjectsImpl::GainCalculatorObjectsImpl
          (GainCalculatorObjectsImpl *this,Layout *layout)

{
  shared_ptr<ear::PointSourcePanner> *this_00;
  Layout local_90;
  
  Layout::Layout(&this->_layout,layout);
  Layout::withoutLfe(&local_90,&this->_layout);
  this_00 = &this->_pointSourcePanner;
  configurePolarPanner((ear *)this_00,&local_90);
  Layout::~Layout(&local_90);
  PolarExtent::PolarExtent(&this->_polarExtentPanner,this_00);
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)&local_90,layout);
  copy_vector<Eigen::Array<bool,__1,_1,_0,__1,_1>,_std::vector<bool,_std::allocator<bool>_>,_0>
            ((ear *)&this->_isLfe,(vector<bool,_std::allocator<bool>_> *)&local_90);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&local_90);
  local_90._name._M_dataplus._M_p._0_4_ =
       (*((this_00->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->_pvTmp,(int *)&local_90);
  return;
}

Assistant:

GainCalculatorObjectsImpl::GainCalculatorObjectsImpl(const Layout& layout)
      : _layout(layout),
        _pointSourcePanner(configurePolarPanner(_layout.withoutLfe())),
        _polarExtentPanner(_pointSourcePanner),
        _isLfe(copy_vector<decltype(_isLfe)>(layout.isLfe())),
        _pvTmp(_pointSourcePanner->numberOfOutputChannels()){}